

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
          (Error *__return_storage_ptr__,Interpreter *this,Expression *aExpr,Expression *aRetExpr)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  string *this_00;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer __x;
  char *pcVar8;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string prefix;
  writer write;
  string lastKey;
  writer write_1;
  StringArray *arrays [6];
  long local_150;
  string local_138;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  writer local_d8;
  char *local_d0;
  char *pcStack_c8;
  char local_c0 [16];
  undefined1 local_b0 [32];
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  Expression *local_68;
  Interpreter *local_60;
  StringArray *local_58;
  StringArray *local_50;
  StringArray *local_48;
  StringArray *local_40;
  
  local_58 = &(this->mContext).mDomAliases;
  local_50 = &(this->mContext).mExportFiles;
  local_48 = &(this->mContext).mImportFiles;
  local_40 = &(this->mContext).mCommandKeys;
  __return_storage_ptr__->mCode = kNone;
  local_e0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_e0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_d0 = local_c0;
  pcStack_c8 = (char *)0x0;
  local_c0[0] = '\0';
  __x = (aExpr->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = aRetExpr;
  local_60 = this;
  if (__x != pbVar2) {
    this_00 = &__return_storage_ptr__->mMessage;
    local_150 = 0;
    bVar4 = false;
    do {
      std::__cxx11::string::substr((ulong)&local_138,(ulong)__x);
      iVar5 = std::__cxx11::string::compare((char *)&local_138);
      if (iVar5 == 0) {
        if (bVar4) {
          local_118.types_[0] = 0xd;
          local_118.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "keyword \'{}\' used with no parameter";
          local_118.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
          local_118.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_118.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_118.context_.types_ = local_118.types_;
          local_118.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "keyword \'{}\' used with no parameter";
          local_d8.handler_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_118.context_.types_;
          do {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&local_d8,pcVar7,"");
                goto LAB_0024c554;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&local_d8,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar8,"",&local_118);
          } while (pcVar7 != "");
LAB_0024c554:
          local_118._0_8_ = local_d0;
          local_118.context_.super_basic_format_parse_context<char>.format_str_.data_ = pcStack_c8;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)&local_118;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x23;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_b0,(v10 *)"keyword \'{}\' used with no parameter",fmt,args);
          local_90 = kInvalidArgs;
          local_88[0] = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_88,local_b0._0_8_,(pointer)(local_b0._0_8_ + local_b0._8_8_));
          __return_storage_ptr__->mCode = local_90;
          std::__cxx11::string::operator=((string *)this_00,(string *)local_88);
          if (local_88[0] != local_78) {
            operator_delete(local_88[0]);
          }
          if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_b0._0_8_ !=
              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_b0 + 0x10)) {
            operator_delete((void *)local_b0._0_8_);
          }
          bVar3 = false;
          iVar5 = 6;
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_d0);
          iVar6 = std::__cxx11::string::compare((char *)__x);
          iVar5 = 0;
          if (iVar6 == 0) {
            local_150 = 1;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)__x);
            if (iVar6 == 0) {
              local_150 = 2;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)__x);
              if (iVar6 != 0) {
                iVar5 = std::__cxx11::string::compare((char *)__x);
                bVar3 = true;
                if (iVar5 != 0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_40,__x);
                  local_150 = 5;
                  goto LAB_0024c406;
                }
                local_150 = 4;
                bVar4 = true;
                iVar5 = 0;
                goto LAB_0024c628;
              }
              local_150 = 3;
            }
          }
          bVar4 = true;
          bVar3 = true;
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((&local_68)[local_150],__x);
LAB_0024c406:
        bVar4 = false;
        bVar3 = true;
        iVar5 = 0;
      }
LAB_0024c628:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if (!bVar3) {
        if (iVar5 == 6) goto LAB_0024c7be;
        if (iVar5 != 2) {
          if (local_d0 != local_c0) {
            operator_delete(local_d0);
          }
          pcVar7 = (this_00->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar7 == local_e0) {
            return __return_storage_ptr__;
          }
          goto LAB_0024c7d3;
        }
        break;
      }
      __x = __x + 1;
    } while (__x != pbVar2);
    if (bVar4) {
      local_118.types_[0] = 0xd;
      pcVar7 = "keyword \'{}\' used with no parameter";
      local_118.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "keyword \'{}\' used with no parameter";
      local_118.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_118.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_118.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_118.context_.types_ = local_118.types_;
      local_118.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_b0._0_8_ = local_118.context_.types_;
      do {
        cVar1 = *pcVar7;
        pcVar8 = pcVar7;
        while (cVar1 != '{') {
          pcVar8 = pcVar8 + 1;
          if (pcVar8 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)local_b0,pcVar7,"");
            goto LAB_0024c722;
          }
          cVar1 = *pcVar8;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_b0,pcVar7,pcVar8);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar8,"",&local_118);
      } while (pcVar7 != "");
LAB_0024c722:
      local_118._0_8_ = local_d0;
      local_118.context_.super_basic_format_parse_context<char>.format_str_.data_ = pcStack_c8;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_118;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x23;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_138,(v10 *)"keyword \'{}\' used with no parameter",fmt_00,args_00);
      local_90 = kInvalidArgs;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + local_138._M_string_length);
      __return_storage_ptr__->mCode = local_90;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_88);
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
    }
  }
LAB_0024c7be:
  pcVar7 = local_d0;
  if (local_d0 != local_c0) {
LAB_0024c7d3:
    operator_delete(pcVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::ReParseMultiNetworkSyntax(const Expression &aExpr, Expression &aRetExpr)
{
    enum
    {
        ST_COMMAND,
        ST_NETWORK,
        ST_DOMAIN,
        ST_EXPORT,
        ST_IMPORT,
        ST_CMD_KEYS
    };
    StringArray *arrays[] = {[ST_COMMAND]  = &aRetExpr,
                             [ST_NETWORK]  = &mContext.mNwkAliases,
                             [ST_DOMAIN]   = &mContext.mDomAliases,
                             [ST_EXPORT]   = &mContext.mExportFiles,
                             [ST_IMPORT]   = &mContext.mImportFiles,
                             [ST_CMD_KEYS] = &mContext.mCommandKeys};
    Error        error;

    uint8_t     state = ST_COMMAND;
    bool        inKey = false;
    std::string lastKey;

    for (const auto &word : aExpr)
    {
        std::string prefix = word.substr(0, 2);

        /*
         * Note: the syntax allows multiple specification of the same key
         *
         * Example: the cases below are parsed equivalently
         *  --nwk nid1 nid2 nid3 --export path
         *  --nwk nid1 --nwk nid2 nid3 --export path
         *  --nwk nid1 --export path --nwk nid2 --nwk nid3
         */

        if (prefix == "--")
        {
            VerifyOrExit(!inKey, error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey));
            lastKey = word;
            inKey   = true;
            if (word == KEYWORD_NETWORK)
                state = ST_NETWORK;
            else if (word == KEYWORD_DOMAIN)
                state = ST_DOMAIN;
            else if (word == KEYWORD_EXPORT)
                state = ST_EXPORT;
            else if (word == KEYWORD_IMPORT)
                state = ST_IMPORT;
            else
            {
                // Some commands have command line parameters that are to be passed without any change including the
                // key.
                inKey = false;
                state = ST_CMD_KEYS;
                arrays[state]->push_back(word);
            }
        }
        else
        {
            inKey = false;
            // Note: avoid accidental conversion of the PSKd to lower case (see TS 8.2, Joining Device Credential
            // in the table 8.2
            arrays[state]->push_back(word);
        }
    }
    if (inKey) // test if we exit for() with trailing keyword
    {
        error = ERROR_INVALID_ARGS(SYNTAX_NO_PARAM, lastKey);
    }
exit:
    return error;
}